

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

word * __thiscall capnp::_::WirePointer::target(WirePointer *this,SegmentReader *segment)

{
  uint uVar1;
  SegmentReader *segment_local;
  WirePointer *this_local;
  
  if (segment == (SegmentReader *)0x0) {
    uVar1 = DirectWireValue<unsigned_int>::get(&this->offsetAndKind);
    this_local = this + (long)((int)uVar1 >> 2) + 1;
  }
  else {
    uVar1 = DirectWireValue<unsigned_int>::get(&this->offsetAndKind);
    this_local = (WirePointer *)
                 SegmentReader::checkOffset(segment,(word *)(this + 1),(long)((int)uVar1 >> 2));
  }
  return (word *)this_local;
}

Assistant:

KJ_ALWAYS_INLINE(const word* target(SegmentReader* segment) const) {
    if (segment == nullptr) {
      return reinterpret_cast<const word*>(this + 1) +
          (static_cast<int32_t>(offsetAndKind.get()) >> 2);
    } else {
      return segment->checkOffset(reinterpret_cast<const word*>(this + 1),
                                  static_cast<int32_t>(offsetAndKind.get()) >> 2);
    }
  }